

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O0

double S2::GetUpdateMinInteriorDistanceMaxError(S1ChordAngle dist)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double a;
  double local_38;
  double local_30;
  double b;
  S1ChordAngle local_20;
  S1ChordAngle local_18;
  S1ChordAngle dist_local;
  
  local_20.length2_ = dist.length2_;
  local_18.length2_ = dist.length2_;
  b = (double)S1ChordAngle::Right();
  bVar1 = operator>=(local_20,(S1ChordAngle)b);
  if (bVar1) {
    dist_local.length2_ = 0.0;
  }
  else {
    local_38 = 1.0;
    dVar3 = S1ChordAngle::length2(&local_18);
    a = dVar3 * 0.5;
    pdVar2 = std::min<double>(&local_38,&a);
    local_30 = *pdVar2;
    dVar3 = sqrt(local_30 * (2.0 - local_30));
    dVar4 = sqrt(3.0);
    dVar5 = sqrt(3.0);
    dVar6 = ((dVar5 * 2.0) / 3.0 + 2.0 + (1.0 - local_30) * 6.5) * local_30;
    dVar5 = sqrt(3.0);
    dist_local.length2_ =
         ((dVar4 * 2.0 + 2.5 + dVar3 * 8.5) * dVar3 + dVar6 +
         (16.0 / dVar5 + 23.0) * 2.220446049250313e-16) * 2.220446049250313e-16;
  }
  return dist_local.length2_;
}

Assistant:

static double GetUpdateMinInteriorDistanceMaxError(S1ChordAngle dist) {
  // If a point is more than 90 degrees from an edge, then the minimum
  // distance is always to one of the endpoints, not to the edge interior.
  if (dist >= S1ChordAngle::Right()) return 0.0;

  // This bound includes all source of error, assuming that the input points
  // are normalized to within the bounds guaranteed to S2Point::Normalize().
  // "a" and "b" are components of chord length that are perpendicular and
  // parallel to the plane containing the edge respectively.
  double b = min(1.0, 0.5 * dist.length2());
  double a = sqrt(b * (2 - b));
  return ((2.5 + 2 * sqrt(3) + 8.5 * a) * a +
          (2 + 2 * sqrt(3) / 3 + 6.5 * (1 - b)) * b +
          (23 + 16 / sqrt(3)) * DBL_EPSILON) * DBL_EPSILON;
}